

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.cpp
# Opt level: O0

json_object * __thiscall
json_deserializer::deserialize(json_object *__return_storage_ptr__,json_deserializer *this)

{
  char ch;
  bool bVar1;
  ostream *poVar2;
  char current;
  json_deserializer *this_local;
  
  ch = json_reader::current(&this->reader);
  bVar1 = is_opener(this,ch);
  if ((bVar1) && (ch == '{')) {
    deserialize_json_object(__return_storage_ptr__,this);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Root tag was not a compound tag");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,(string *)&(this->reader).cbuf);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    memset(__return_storage_ptr__,0,0x38);
    json_object::json_object(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

json_object deserialize() {
        char current = reader.current();
        if (is_opener(current) && current == opening_object) {
            return deserialize_json_object();
        }
        cerr << "Root tag was not a compound tag" << endl << reader.cbuf << endl;
        return json_object();
    }